

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
ot::commissioner::Interpreter::NetworkSelectionComparator::NetworkSelectionComparator
          (NetworkSelectionComparator *this,Interpreter *aInterpreter)

{
  Status SVar1;
  Network nwk;
  Network local_70;
  
  this->mInterpreter = aInterpreter;
  persistent_storage::Network::Network(&local_70);
  SVar1 = persistent_storage::Registry::GetCurrentNetwork
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_70);
  this->mSuccess = SVar1 == kSuccess;
  if (SVar1 == kSuccess) {
    this->mStartWith = local_70.mXpan;
  }
  persistent_storage::Network::~Network(&local_70);
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::NetworkSelectionComparator(const Interpreter &aInterpreter)
    : mInterpreter(aInterpreter)
{
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

    mSuccess = status == RegistryStatus::kSuccess;
    if (mSuccess)
    {
        mStartWith = nwk.mXpan;
    }
}